

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int agent_list_identities(LIBSSH2_AGENT *agent)

{
  uint32_t uVar1;
  list_node *entry;
  list_head *plVar2;
  ulong __n;
  list_node *plVar3;
  uchar *puVar4;
  bool bVar5;
  size_t comment_len;
  agent_publickey *identity;
  uchar c;
  uchar *puStack_38;
  int rc;
  uchar *s;
  ssize_t num_identities;
  ssize_t len;
  agent_transaction_ctx_t transctx;
  LIBSSH2_AGENT *agent_local;
  
  len = (ssize_t)&agent->transctx;
  identity._3_1_ = 0xb;
  if ((agent->transctx).state == agent_NB_state_init) {
    ((agent_transaction_ctx *)len)->request = (uchar *)((long)&identity + 3);
    (agent->transctx).request_len = 1;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).state = agent_NB_state_request_created;
  }
  transctx = (agent_transaction_ctx_t)agent;
  if (*((agent_transaction_ctx *)len)->request == '\v') {
    if (agent->ops == (agent_ops *)0x0) {
      agent_local._4_4_ = _libssh2_error(agent->session,-0x27,"agent not connected");
    }
    else {
      identity._4_4_ = (*agent->ops->transact)(agent,(agent_transaction_ctx_t)len);
      if (identity._4_4_ == 0) {
        *(undefined8 *)len = 0;
        puStack_38 = *(uchar **)(len + 0x10);
        num_identities = *(long *)(len + 0x18) + -1;
        if (num_identities < 0) {
          identity._4_4_ = -0x2a;
        }
        else if (*puStack_38 == '\f') {
          puStack_38 = puStack_38 + 1;
          num_identities = *(long *)(len + 0x18) + -5;
          if (num_identities < 0) {
            identity._4_4_ = -0x2a;
          }
          else {
            uVar1 = _libssh2_ntohu32(puStack_38);
            s = (uchar *)(ulong)uVar1;
            puStack_38 = puStack_38 + 4;
            while (puVar4 = s + -1, bVar5 = s != (uchar *)0x0, s = puVar4, bVar5) {
              num_identities = num_identities + -4;
              if (num_identities < 0) {
                identity._4_4_ = -0x2a;
                break;
              }
              entry = (list_node *)(**(code **)(transctx->request + 8))(0x40,transctx->request);
              if (entry == (list_node *)0x0) {
                identity._4_4_ = -6;
                break;
              }
              uVar1 = _libssh2_ntohu32(puStack_38);
              entry[2].next = (list_node *)(ulong)uVar1;
              puStack_38 = puStack_38 + 4;
              num_identities = num_identities - (long)entry[2].next;
              if (num_identities < 0) {
                identity._4_4_ = -0x2a;
                (**(code **)(transctx->request + 0x18))(entry,transctx->request);
                break;
              }
              plVar2 = (list_head *)
                       (**(code **)(transctx->request + 8))(entry[2].next,transctx->request);
              entry[1].head = plVar2;
              if (entry[1].head == (list_head *)0x0) {
                identity._4_4_ = -6;
                (**(code **)(transctx->request + 0x18))(entry,transctx->request);
                break;
              }
              memcpy(entry[1].head,puStack_38,(size_t)entry[2].next);
              puStack_38 = puStack_38 + (long)entry[2].next;
              num_identities = num_identities + -4;
              if (num_identities < 0) {
                identity._4_4_ = -0x2a;
                (**(code **)(transctx->request + 0x18))(entry[1].head,transctx->request);
                (**(code **)(transctx->request + 0x18))(entry,transctx->request);
                break;
              }
              uVar1 = _libssh2_ntohu32(puStack_38);
              __n = (ulong)uVar1;
              puStack_38 = puStack_38 + 4;
              if ((ulong)num_identities < __n) {
                identity._4_4_ = -0x2a;
                (**(code **)(transctx->request + 0x18))(entry[1].head,transctx->request);
                (**(code **)(transctx->request + 0x18))(entry,transctx->request);
                break;
              }
              num_identities = num_identities - __n;
              plVar3 = (list_node *)(**(code **)(transctx->request + 8))(__n + 1,transctx->request);
              entry[2].prev = plVar3;
              if (entry[2].prev == (list_node *)0x0) {
                identity._4_4_ = -6;
                (**(code **)(transctx->request + 0x18))(entry[1].head,transctx->request);
                (**(code **)(transctx->request + 0x18))(entry,transctx->request);
                break;
              }
              *(undefined1 *)((long)&(entry[2].prev)->next + __n) = 0;
              memcpy(entry[2].prev,puStack_38,__n);
              puStack_38 = puStack_38 + __n;
              _libssh2_list_add((list_head *)&transctx[1].state,entry);
            }
          }
        }
        else {
          identity._4_4_ = -0x2a;
        }
        (**(code **)(transctx->request + 0x18))(*(undefined8 *)(len + 0x10),transctx->request);
        *(undefined8 *)(len + 0x10) = 0;
        agent_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)transctx->request,identity._4_4_,
                            "agent list id failed");
      }
      else {
        (**(code **)(transctx->request + 0x18))(*(undefined8 *)(len + 0x10),transctx->request);
        *(undefined8 *)(len + 0x10) = 0;
        agent_local._4_4_ = identity._4_4_;
      }
    }
  }
  else {
    agent_local._4_4_ = _libssh2_error(agent->session,-0x27,"illegal agent request");
  }
  return agent_local._4_4_;
}

Assistant:

static int
agent_list_identities(LIBSSH2_AGENT *agent)
{
    agent_transaction_ctx_t transctx = &agent->transctx;
    ssize_t len, num_identities;
    unsigned char *s;
    int rc;
    unsigned char c = SSH2_AGENTC_REQUEST_IDENTITIES;

    /* Create a request to list identities */
    if(transctx->state == agent_NB_state_init) {
        transctx->request = &c;
        transctx->request_len = 1;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_REQUEST_IDENTITIES)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "illegal agent request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        LIBSSH2_FREE(agent->session, transctx->response);
        transctx->response = NULL;
        return rc;
    }
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_IDENTITIES_ANSWER) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Read the length of identities */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    num_identities = _libssh2_ntohu32(s);
    s += 4;

    while(num_identities--) {
        struct agent_publickey *identity;
        size_t comment_len;

        /* Read the length of the blob */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            goto error;
        }
        identity = LIBSSH2_ALLOC(agent->session, sizeof(*identity));
        if(!identity) {
            rc = LIBSSH2_ERROR_ALLOC;
            goto error;
        }
        identity->external.blob_len = _libssh2_ntohu32(s);
        s += 4;

        /* Read the blob */
        len -= identity->external.blob_len;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }

        identity->external.blob = LIBSSH2_ALLOC(agent->session,
                                                identity->external.blob_len);
        if(!identity->external.blob) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        memcpy(identity->external.blob, s, identity->external.blob_len);
        s += identity->external.blob_len;

        /* Read the length of the comment */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        comment_len = _libssh2_ntohu32(s);
        s += 4;

        if(comment_len > (size_t)len) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        /* Read the comment */
        len -= comment_len;

        identity->external.comment = LIBSSH2_ALLOC(agent->session,
                                                   comment_len + 1);
        if(!identity->external.comment) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        identity->external.comment[comment_len] = '\0';
        memcpy(identity->external.comment, s, comment_len);
        s += comment_len;

        _libssh2_list_add(&agent->head, &identity->node);
    }
error:
    LIBSSH2_FREE(agent->session, transctx->response);
    transctx->response = NULL;

    return _libssh2_error(agent->session, rc,
                          "agent list id failed");
}